

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O1

void __thiscall ACustomBridge::BeginPlay(ACustomBridge *this)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  if ((this->super_AActor).args[2] == 0) {
    iVar1 = (this->super_AActor).args[0];
    iVar2 = (this->super_AActor).args[1];
    if (iVar1 == 0) {
      dVar3 = 36.0;
    }
    else {
      dVar3 = (double)iVar1;
    }
    (this->super_AActor).radius = dVar3;
    if (iVar2 == 0) {
      dVar3 = 4.0;
    }
    else {
      dVar3 = (double)iVar2;
    }
    (this->super_AActor).Height = dVar3;
    (this->super_AActor).RenderStyle = LegacyRenderStyles[1];
  }
  else {
    AActor::SetState(&this->super_AActor,(this->super_AActor).SeeState,false);
    iVar1 = (this->super_AActor).args[0];
    iVar2 = (this->super_AActor).args[1];
    if (iVar1 == 0) {
      dVar3 = 32.0;
    }
    else {
      dVar3 = (double)iVar1;
    }
    (this->super_AActor).radius = dVar3;
    if (iVar2 == 0) {
      dVar3 = 2.0;
    }
    else {
      dVar3 = (double)iVar2;
    }
    (this->super_AActor).Height = dVar3;
  }
  return;
}

Assistant:

void ACustomBridge::BeginPlay ()
{
	if (args[2]) // Hexen bridge if there are balls
	{
		SetState(SeeState);
		radius = args[0] ? args[0] : 32;
		Height = args[1] ? args[1] : 2;
	}
	else // No balls? Then a Doom bridge.
	{
		radius = args[0] ? args[0] : 36;
		Height = args[1] ? args[1] : 4;
		RenderStyle = STYLE_Normal;
	}
}